

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long>
slang::ast::dynamicBitstreamSize(Type *type,BitstreamSizeMode mode)

{
  bool bVar1;
  bitwidth_t bVar2;
  FixedSizeUnpackedArrayType *pFVar3;
  UnpackedStructType *pUVar4;
  Type *pTVar5;
  ClassType *pCVar6;
  type *ptVar7;
  type *ptVar8;
  type *fixedSizeElem_2;
  type *multiplierElem_2;
  ClassPropertySymbol *local_108;
  ClassPropertySymbol *prop;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __end5;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin5;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
  *__range5;
  ClassType *ct_1;
  type *fixedSizeElem_1;
  type *multiplierElem_1;
  FieldSymbol *local_b0;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end4;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin4;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> *__range4;
  UnpackedStructType *us;
  bitwidth_t rw;
  Type *ct;
  type *fixedSizeElem;
  type *multiplierElem;
  unsigned_long local_48;
  size_t multiplier;
  int local_38 [2];
  ulong local_30;
  size_t fixedSize;
  Type *pTStack_20;
  BitstreamSizeMode mode_local;
  Type *type_local;
  
  fixedSize._4_4_ = mode;
  pTStack_20 = type;
  bVar2 = Type::getBitWidth(type);
  local_30 = (ulong)bVar2;
  if (local_30 == 0) {
    bVar1 = Type::isString(pTStack_20);
    if (bVar1) {
      local_38[0] = 8;
      if (fixedSize._4_4_ == DestEmpty) {
        local_38[0] = 0;
      }
      multiplier._4_4_ = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                ((pair<unsigned_long,_unsigned_long> *)&type_local,local_38,
                 (int *)((long)&multiplier + 4));
    }
    else {
      local_48 = 0;
      bVar1 = Type::isUnpackedArray(pTStack_20);
      if (bVar1) {
        pTVar5 = Type::getArrayElementType(pTStack_20);
        _multiplierElem = dynamicBitstreamSize(pTVar5,fixedSize._4_4_);
        ptVar7 = std::get<0ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)&multiplierElem);
        ptVar8 = std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)&multiplierElem);
        pTVar5 = Type::getCanonicalType(pTStack_20);
        if ((pTVar5->super_Symbol).kind == FixedSizeUnpackedArrayType) {
          pFVar3 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>(&pTVar5->super_Symbol);
          bVar2 = ConstantRange::width(&pFVar3->range);
          local_48 = *ptVar7 * (ulong)bVar2;
          local_30 = *ptVar8 * (ulong)bVar2;
        }
        else if (fixedSize._4_4_ == DestFill) {
          if (*ptVar7 == 0) {
            local_48 = *ptVar8;
          }
          else {
            local_48 = *ptVar7;
            local_30 = *ptVar8;
          }
        }
        else if (fixedSize._4_4_ == Source) {
          local_48 = std::gcd<unsigned_long,unsigned_long>(*ptVar7,*ptVar8);
        }
      }
      else {
        bVar1 = Type::isUnpackedStruct(pTStack_20);
        if (bVar1) {
          pTVar5 = Type::getCanonicalType(pTStack_20);
          pUVar4 = Symbol::as<slang::ast::UnpackedStructType>(&pTVar5->super_Symbol);
          ___begin4 = Scope::membersOfType<slang::ast::FieldSymbol>(&pUVar4->super_Scope);
          __end4 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                   ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                            *)&__begin4);
          field = (FieldSymbol *)
                  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                  ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                         *)&__begin4);
          while (bVar1 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_std::forward_iterator_tag,_const_slang::ast::FieldSymbol,_long,_const_slang::ast::FieldSymbol_*,_const_slang::ast::FieldSymbol_&>
                         ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_std::forward_iterator_tag,_const_slang::ast::FieldSymbol,_long,_const_slang::ast::FieldSymbol_*,_const_slang::ast::FieldSymbol_&>
                                       *)&__end4,
                                      (specific_symbol_iterator<slang::ast::FieldSymbol> *)&field),
                bVar1) {
            local_b0 = Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator*(&__end4);
            pTVar5 = ValueSymbol::getType((ValueSymbol *)local_b0);
            _multiplierElem_1 = dynamicBitstreamSize(pTVar5,fixedSize._4_4_);
            ptVar7 = std::get<0ul,unsigned_long,unsigned_long>
                               ((pair<unsigned_long,_unsigned_long> *)&multiplierElem_1);
            ptVar8 = std::get<1ul,unsigned_long,unsigned_long>
                               ((pair<unsigned_long,_unsigned_long> *)&multiplierElem_1);
            if ((fixedSize._4_4_ == DestFill) && (*ptVar7 != 0)) {
              fixedSize._4_4_ = DestEmpty;
            }
            local_48 = std::gcd<unsigned_long,unsigned_long>(local_48,*ptVar7);
            local_30 = *ptVar8 + local_30;
            Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator++(&__end4);
          }
        }
        else {
          bVar1 = Type::isClass(pTStack_20);
          if (bVar1) {
            pTVar5 = Type::getCanonicalType(pTStack_20);
            pCVar6 = Symbol::as<slang::ast::ClassType>(&pTVar5->super_Symbol);
            ___begin5 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(&pCVar6->super_Scope);
            __end5 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                     ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                              *)&__begin5);
            prop = (ClassPropertySymbol *)
                   iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                   ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                          *)&__begin5);
            while (bVar1 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_std::forward_iterator_tag,_const_slang::ast::ClassPropertySymbol,_long,_const_slang::ast::ClassPropertySymbol_*,_const_slang::ast::ClassPropertySymbol_&>
                           ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_std::forward_iterator_tag,_const_slang::ast::ClassPropertySymbol,_long,_const_slang::ast::ClassPropertySymbol_*,_const_slang::ast::ClassPropertySymbol_&>
                                         *)&__end5,
                                        (specific_symbol_iterator<slang::ast::ClassPropertySymbol> *
                                        )&prop), bVar1) {
              local_108 = Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::
                          operator*(&__end5);
              pTVar5 = ValueSymbol::getType((ValueSymbol *)local_108);
              _multiplierElem_2 = dynamicBitstreamSize(pTVar5,fixedSize._4_4_);
              ptVar7 = std::get<0ul,unsigned_long,unsigned_long>
                                 ((pair<unsigned_long,_unsigned_long> *)&multiplierElem_2);
              ptVar8 = std::get<1ul,unsigned_long,unsigned_long>
                                 ((pair<unsigned_long,_unsigned_long> *)&multiplierElem_2);
              local_48 = std::gcd<unsigned_long,unsigned_long>(local_48,*ptVar7);
              local_30 = *ptVar8 + local_30;
              Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::operator++(&__end5);
            }
          }
        }
      }
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                ((pair<unsigned_long,_unsigned_long> *)&type_local,&local_48,&local_30);
    }
  }
  else {
    local_38[1] = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&type_local,local_38 + 1,&local_30);
  }
  return _type_local;
}

Assistant:

static std::pair<size_t, size_t> dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    size_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0 : CHAR_BIT, 0};

    // TODO: check for overflow
    size_t multiplier = 0;
    if (type.isUnpackedArray()) {
        auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(*type.getArrayElementType(),
                                                                    mode);

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            multiplier = multiplierElem * rw;
            fixedSize = fixedSizeElem * rw;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!multiplierElem)
                multiplier = fixedSizeElem; // element is fixed size
            else {
                multiplier = multiplierElem; // element is dynamically sized
                fixedSize = fixedSizeElem;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(multiplierElem, fixedSizeElem);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto& field : us.membersOfType<FieldSymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(field.getType(), mode);
            if (mode == BitstreamSizeMode::DestFill && multiplierElem > 0) {
                // dynamically sized field filled and rest should be empty
                mode = BitstreamSizeMode::DestEmpty;
            }

            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(prop.getType(), mode);
            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }

    return {multiplier, fixedSize};
}